

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O2

void tnt_iter_map_rewind(tnt_iter *i)

{
  (i->data).map.cur_index = -1;
  i->status = TNT_ITER_OK;
  (i->data).array.elem = (char *)0x0;
  (i->data).array.elem_end = (char *)0x0;
  (i->data).map.value = (char *)0x0;
  (i->data).map.value_end = (char *)0x0;
  return;
}

Assistant:

static void tnt_iter_map_rewind(struct tnt_iter *i) {
	struct tnt_iter_map *itr = TNT_IMAP(i);
	itr->cur_index = -1;
	itr->key = NULL;
	itr->key_end = NULL;
	itr->value = NULL;
	itr->value_end = NULL;
	i->status = TNT_ITER_OK;
}